

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_Package_Test::TestBody
          (FileDescriptorTest_Package_Test *this)

{
  string *psVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  psVar1 = ((this->super_FileDescriptorTest).foo_file_)->package_;
  local_38._M_str = (psVar1->_M_dataplus)._M_p;
  local_38._M_len = psVar1->_M_string_length;
  pcVar2 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::basic_string_view<char,std::char_traits<char>>>
            (local_28,"\"\"","foo_file_->package()",(char (*) [1])(anon_var_dwarf_a12c75 + 5),
             &local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_len + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  psVar1 = ((this->super_FileDescriptorTest).bar_file_)->package_;
  local_38._M_str = (psVar1->_M_dataplus)._M_p;
  local_38._M_len = psVar1->_M_string_length;
  testing::internal::CmpHelperEQ<char[12],std::basic_string_view<char,std::char_traits<char>>>
            (local_28,"\"bar_package\"","bar_file_->package()",(char (*) [12])"bar_package",
             &local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_len + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST_F(FileDescriptorTest, Package) {
  EXPECT_EQ("", foo_file_->package());
  EXPECT_EQ("bar_package", bar_file_->package());
}